

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool run_container_is_subset(run_container_t *container1,run_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  iVar3 = 0;
  iVar6 = 0;
  do {
    lVar5 = (long)iVar6;
    while( true ) {
      iVar4 = (int)lVar5;
      if ((container1->n_runs <= iVar4) || (container2->n_runs <= iVar3)) {
        return container1->n_runs == iVar4;
      }
      uVar1 = container1->runs[lVar5].value;
      uVar2 = container2->runs[iVar3].value;
      if (uVar1 < uVar2) {
        return false;
      }
      uVar7 = (uint)container2->runs[iVar3].length + (uint)uVar2;
      uVar8 = (uint)container1->runs[lVar5].length + (uint)uVar1;
      if (uVar7 <= uVar8) break;
      lVar5 = lVar5 + 1;
    }
    iVar6 = iVar4 + 1;
    if (uVar8 != uVar7) {
      iVar6 = iVar4;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

bool run_container_is_subset(const run_container_t *container1,
                             const run_container_t *container2) {
    int i1 = 0, i2 = 0;
    while (i1 < container1->n_runs && i2 < container2->n_runs) {
        int start1 = container1->runs[i1].value;
        int stop1 = start1 + container1->runs[i1].length;
        int start2 = container2->runs[i2].value;
        int stop2 = start2 + container2->runs[i2].length;
        if (start1 < start2) {
            return false;
        } else {  // start1 >= start2
            if (stop1 < stop2) {
                i1++;
            } else if (stop1 == stop2) {
                i1++;
                i2++;
            } else {  // stop1 > stop2
                i2++;
            }
        }
    }
    if (i1 == container1->n_runs) {
        return true;
    } else {
        return false;
    }
}